

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unicodeNext(sqlite3_tokenizer_cursor *pC,char **paToken,int *pnToken,int *piStart,int *piEnd,
               int *piPos)

{
  unicode_tokenizer *p_00;
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  byte bVar4;
  int iVar5;
  uchar *puVar6;
  sqlite3_tokenizer *psVar7;
  uchar *puVar8;
  uchar *puVar9;
  bool bVar10;
  char *zNew;
  int iOut;
  uchar *zTerm;
  uchar *zEnd;
  uchar *zStart;
  uchar *z;
  char *zOut;
  uint iCode;
  unicode_tokenizer *p;
  unicode_cursor *pCsr;
  int *piPos_local;
  int *piEnd_local;
  int *piStart_local;
  int *pnToken_local;
  char **paToken_local;
  sqlite3_tokenizer_cursor *pC_local;
  
  p_00 = (unicode_tokenizer *)pC->pTokenizer;
  zOut._4_4_ = 0;
  zStart = (uchar *)((long)&(pC[1].pTokenizer)->pModule +
                    (long)*(int *)((long)&pC[2].pTokenizer + 4));
  puVar6 = (uchar *)((long)&(pC[1].pTokenizer)->pModule + (long)*(int *)&pC[2].pTokenizer);
  do {
    puVar3 = zStart;
    if (puVar6 <= zStart) break;
    puVar8 = zStart + 1;
    zOut._4_4_ = (uint)*zStart;
    zStart = puVar8;
    if (0xbf < zOut._4_4_) {
      zOut._4_4_ = (uint)""[zOut._4_4_ - 0xc0];
      while( true ) {
        bVar10 = false;
        if (zStart != puVar6) {
          bVar10 = (*zStart & 0xc0) == 0x80;
        }
        if (!bVar10) break;
        zOut._4_4_ = zOut._4_4_ * 0x40 + (*zStart & 0x3f);
        zStart = zStart + 1;
      }
      if (((zOut._4_4_ < 0x80) || ((zOut._4_4_ & 0xfffff800) == 0xd800)) ||
         ((zOut._4_4_ & 0xfffffffe) == 0xfffe)) {
        zOut._4_4_ = 0xfffd;
      }
    }
    iVar5 = unicodeIsAlnum(p_00,zOut._4_4_);
  } while (iVar5 == 0);
  if (puVar3 < puVar6) {
    z = (uchar *)pC[4].pTokenizer;
    do {
      puVar8 = zStart;
      if ((long)(*(int *)&pC[5].pTokenizer + -4) <= (long)z - (long)pC[4].pTokenizer) {
        psVar7 = (sqlite3_tokenizer *)
                 sqlite3_realloc64(pC[4].pTokenizer,(long)(*(int *)&pC[5].pTokenizer + 0x40));
        if (psVar7 == (sqlite3_tokenizer *)0x0) {
          return 7;
        }
        z = (uchar *)((long)psVar7 + ((long)z - (long)pC[4].pTokenizer));
        pC[4].pTokenizer = psVar7;
        *(int *)&pC[5].pTokenizer = *(int *)&pC[5].pTokenizer + 0x40;
      }
      iVar5 = sqlite3FtsUnicodeFold(zOut._4_4_,p_00->eRemoveDiacritic);
      if (iVar5 != 0) {
        bVar4 = (byte)iVar5;
        if (iVar5 < 0x80) {
          *z = bVar4;
          z = z + 1;
        }
        else {
          bVar1 = (byte)(iVar5 >> 6);
          if (iVar5 < 0x800) {
            puVar9 = z + 1;
            *z = (bVar1 & 0x1f) - 0x40;
            z = z + 2;
            *puVar9 = (bVar4 & 0x3f) + 0x80;
          }
          else {
            bVar2 = (byte)(iVar5 >> 0xc);
            if (iVar5 < 0x10000) {
              *z = (bVar2 & 0xf) - 0x20;
              puVar9 = z + 2;
              z[1] = (bVar1 & 0x3f) + 0x80;
              z = z + 3;
              *puVar9 = (bVar4 & 0x3f) + 0x80;
            }
            else {
              *z = ((byte)(iVar5 >> 0x12) & 7) - 0x10;
              z[1] = (bVar2 & 0x3f) + 0x80;
              puVar9 = z + 3;
              z[2] = (bVar1 & 0x3f) + 0x80;
              z = z + 4;
              *puVar9 = (bVar4 & 0x3f) + 0x80;
            }
          }
        }
      }
      if (puVar6 <= zStart) break;
      puVar9 = zStart + 1;
      zOut._4_4_ = (uint)*zStart;
      zStart = puVar9;
      if (0xbf < zOut._4_4_) {
        zOut._4_4_ = (uint)""[zOut._4_4_ - 0xc0];
        while( true ) {
          bVar10 = false;
          if (zStart != puVar6) {
            bVar10 = (*zStart & 0xc0) == 0x80;
          }
          if (!bVar10) break;
          zOut._4_4_ = zOut._4_4_ * 0x40 + (*zStart & 0x3f);
          zStart = zStart + 1;
        }
        if (((zOut._4_4_ < 0x80) || ((zOut._4_4_ & 0xfffff800) == 0xd800)) ||
           ((zOut._4_4_ & 0xfffffffe) == 0xfffe)) {
          zOut._4_4_ = 0xfffd;
        }
      }
      iVar5 = unicodeIsAlnum(p_00,zOut._4_4_);
      bVar10 = true;
      if (iVar5 == 0) {
        iVar5 = sqlite3FtsUnicodeIsdiacritic(zOut._4_4_);
        bVar10 = iVar5 != 0;
      }
    } while (bVar10);
    *(int *)((long)&pC[2].pTokenizer + 4) = (int)zStart - (int)pC[1].pTokenizer;
    *paToken = (char *)pC[4].pTokenizer;
    *pnToken = (int)z - (int)pC[4].pTokenizer;
    *piStart = (int)puVar3 - (int)pC[1].pTokenizer;
    *piEnd = (int)puVar8 - (int)pC[1].pTokenizer;
    iVar5 = *(int *)&pC[3].pTokenizer;
    *(int *)&pC[3].pTokenizer = iVar5 + 1;
    *piPos = iVar5;
    pC_local._4_4_ = 0;
  }
  else {
    pC_local._4_4_ = 0x65;
  }
  return pC_local._4_4_;
}

Assistant:

static int unicodeNext(
  sqlite3_tokenizer_cursor *pC,   /* Cursor returned by simpleOpen */
  const char **paToken,           /* OUT: Token text */
  int *pnToken,                   /* OUT: Number of bytes at *paToken */
  int *piStart,                   /* OUT: Starting offset of token */
  int *piEnd,                     /* OUT: Ending offset of token */
  int *piPos                      /* OUT: Position integer of token */
){
  unicode_cursor *pCsr = (unicode_cursor *)pC;
  unicode_tokenizer *p = ((unicode_tokenizer *)pCsr->base.pTokenizer);
  unsigned int iCode = 0;
  char *zOut;
  const unsigned char *z = &pCsr->aInput[pCsr->iOff];
  const unsigned char *zStart = z;
  const unsigned char *zEnd;
  const unsigned char *zTerm = &pCsr->aInput[pCsr->nInput];

  /* Scan past any delimiter characters before the start of the next token.
  ** Return SQLITE_DONE early if this takes us all the way to the end of 
  ** the input.  */
  while( z<zTerm ){
    READ_UTF8(z, zTerm, iCode);
    if( unicodeIsAlnum(p, (int)iCode) ) break;
    zStart = z;
  }
  if( zStart>=zTerm ) return SQLITE_DONE;

  zOut = pCsr->zToken;
  do {
    int iOut;

    /* Grow the output buffer if required. */
    if( (zOut-pCsr->zToken)>=(pCsr->nAlloc-4) ){
      char *zNew = sqlite3_realloc64(pCsr->zToken, pCsr->nAlloc+64);
      if( !zNew ) return SQLITE_NOMEM;
      zOut = &zNew[zOut - pCsr->zToken];
      pCsr->zToken = zNew;
      pCsr->nAlloc += 64;
    }

    /* Write the folded case of the last character read to the output */
    zEnd = z;
    iOut = sqlite3FtsUnicodeFold((int)iCode, p->eRemoveDiacritic);
    if( iOut ){
      WRITE_UTF8(zOut, iOut);
    }

    /* If the cursor is not at EOF, read the next character */
    if( z>=zTerm ) break;
    READ_UTF8(z, zTerm, iCode);
  }while( unicodeIsAlnum(p, (int)iCode) 
       || sqlite3FtsUnicodeIsdiacritic((int)iCode)
  );

  /* Set the output variables and return. */
  pCsr->iOff = (int)(z - pCsr->aInput);
  *paToken = pCsr->zToken;
  *pnToken = (int)(zOut - pCsr->zToken);
  *piStart = (int)(zStart - pCsr->aInput);
  *piEnd = (int)(zEnd - pCsr->aInput);
  *piPos = pCsr->iToken++;
  return SQLITE_OK;
}